

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

void __thiscall
lscpp::stdio_transporter::write_message_impl(stdio_transporter *this,string *str,bool close_file)

{
  void *__buf;
  size_t in_RCX;
  pointer __buf_00;
  
  __buf_00 = (str->_M_dataplus)._M_p;
  __buf = (void *)str->_M_string_length;
  write(1,__buf_00,(size_t)__buf);
  if ((this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
    comm_logger::open_out((comm_logger *)this);
    comm_logger::write((comm_logger *)this,(int)__buf_00,__buf,in_RCX);
    if (close_file) {
      comm_logger::close((comm_logger *)this,(int)__buf_00);
      return;
    }
  }
  return;
}

Assistant:

void stdio_transporter::write_message_impl(std::string str, bool close_file) {
  const char *cstr = str.c_str();
  std::size_t sizeof_reply = str.size();
  ::write(stdout_fileno, cstr, sizeof_reply);
  log_out_message(comm_logger_, cstr, sizeof_reply, close_file);
}